

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.cpp
# Opt level: O0

void __thiscall
sai::Document::IterateLayerFiles(Document *this,function<bool_(sai::VirtualFileEntry_&)> *LayerProc)

{
  bool *__s;
  undefined8 this_00;
  bool bVar1;
  VirtualFileEntry *pVVar2;
  LayerTableEntry LVar3;
  int local_13c;
  undefined1 local_138 [8];
  optional<sai::VirtualFileEntry> LayerFile;
  char LayerPath [32];
  LayerTableEntry CurLayerEntry;
  uint local_8c;
  undefined1 local_88 [4];
  uint32_t LayerCount;
  optional<sai::VirtualFileEntry> LayerTableFile;
  function<bool_(sai::VirtualFileEntry_&)> *LayerProc_local;
  Document *this_local;
  
  LayerTableFile.super__Optional_base<sai::VirtualFileEntry,_false,_false>._M_payload.
  super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
  super__Optional_payload_base<sai::VirtualFileEntry>._104_8_ = LayerProc;
  VirtualFileSystem::GetEntry
            ((optional<sai::VirtualFileEntry> *)local_88,&this->super_VirtualFileSystem,"laytbl");
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_88);
  if (bVar1) {
    pVVar2 = std::optional<sai::VirtualFileEntry>::operator->
                       ((optional<sai::VirtualFileEntry> *)local_88);
    local_8c = VirtualFileEntry::Read<unsigned_int>(pVVar2);
    do {
      if (local_8c == 0) break;
      pVVar2 = std::optional<sai::VirtualFileEntry>::operator->
                         ((optional<sai::VirtualFileEntry> *)local_88);
      LVar3 = VirtualFileEntry::Read<sai::LayerTableEntry>(pVVar2);
      LayerFile.super__Optional_base<sai::VirtualFileEntry,_false,_false>._M_payload.
      super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
      super__Optional_payload_base<sai::VirtualFileEntry>._M_engaged = false;
      LayerFile.super__Optional_base<sai::VirtualFileEntry,_false,_false>._M_payload.
      super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
      super__Optional_payload_base<sai::VirtualFileEntry>._105_7_ = 0;
      __s = &LayerFile.super__Optional_base<sai::VirtualFileEntry,_false,_false>._M_payload.
             super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
             super__Optional_payload_base<sai::VirtualFileEntry>._M_engaged;
      snprintf(__s,0x20,"/layers/%08x",(ulong)LVar3 & 0xffffffff);
      VirtualFileSystem::GetEntry
                ((optional<sai::VirtualFileEntry> *)local_138,&this->super_VirtualFileSystem,__s);
      bVar1 = std::optional::operator_cast_to_bool((optional *)local_138);
      this_00 = LayerTableFile.super__Optional_base<sai::VirtualFileEntry,_false,_false>._M_payload.
                super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
                super__Optional_payload_base<sai::VirtualFileEntry>._104_8_;
      if (bVar1) {
        pVVar2 = std::optional<sai::VirtualFileEntry>::operator*
                           ((optional<sai::VirtualFileEntry> *)local_138);
        bVar1 = std::function<bool_(sai::VirtualFileEntry_&)>::operator()
                          ((function<bool_(sai::VirtualFileEntry_&)> *)this_00,pVVar2);
        if (bVar1) goto LAB_00105f59;
        local_13c = 3;
      }
      else {
LAB_00105f59:
        local_13c = 0;
      }
      std::optional<sai::VirtualFileEntry>::~optional((optional<sai::VirtualFileEntry> *)local_138);
      local_8c = local_8c - 1;
    } while (local_13c == 0);
  }
  std::optional<sai::VirtualFileEntry>::~optional((optional<sai::VirtualFileEntry> *)local_88);
  return;
}

Assistant:

void Document::IterateLayerFiles(const std::function<bool(VirtualFileEntry&)>& LayerProc)
{
	if( std::optional<VirtualFileEntry> LayerTableFile = GetEntry("laytbl"); LayerTableFile )
	{
		std::uint32_t LayerCount = LayerTableFile->Read<std::uint32_t>();
		while( LayerCount-- ) // Read each layer entry
		{
			const LayerTableEntry CurLayerEntry = LayerTableFile->Read<LayerTableEntry>();
			char                  LayerPath[32] = {};
			std::snprintf(LayerPath, 32u, "/layers/%08x", CurLayerEntry.Identifier);
			if( std::optional<VirtualFileEntry> LayerFile = GetEntry(LayerPath); LayerFile )
			{
				if( !LayerProc(*LayerFile) )
					break;
			}
		}
	}
}